

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  undefined8 in_RAX;
  long lVar1;
  long lVar2;
  ostream *poVar3;
  char cVar4;
  char *pcVar5;
  undefined8 *puVar6;
  undefined8 uStack_38;
  
  puVar6 = (undefined8 *)op.m_size;
  lVar1 = *(long *)(os + 8);
  uStack_38 = in_RAX;
  if ((ulong)(puVar6[1] + lVar1) < 0x28) {
    lVar1 = std::__cxx11::string::find((char)os,10);
    if (lVar1 == -1) {
      lVar2 = std::__cxx11::string::find((char)op.m_size,10);
      lVar1 = *(long *)(os + 8);
      if (lVar2 == -1) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,*(char **)os,lVar1);
        cVar4 = ' ';
        uStack_38._0_5_ = CONCAT14(0x20,(undefined4)uStack_38);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)((long)&uStack_38 + 4),1);
        poVar3 = (ostream *)std::ostream::write((char *)poVar3,(long)lhs);
        pcVar5 = (char *)((long)&uStack_38 + 5);
        goto LAB_0018beb4;
      }
    }
    else {
      lVar1 = *(long *)(os + 8);
    }
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,*(char **)os,lVar1);
  cVar4 = '\n';
  uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_38 + 6),1);
  poVar3 = (ostream *)std::ostream::write((char *)poVar3,(long)lhs);
  pcVar5 = (char *)((long)&uStack_38 + 7);
LAB_0018beb4:
  *pcVar5 = cVar4;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)*puVar6,puVar6[1]);
  return;
}

Assistant:

void formatReconstructedExpression(std::ostream &os, std::string const &lhs, StringRef op, std::string const &rhs) {
        if (lhs.size() + rhs.size() < 40 &&
            lhs.find('\n') == std::string::npos &&
            rhs.find('\n') == std::string::npos)
            os << lhs << ' ' << op << ' ' << rhs;
        else
            os << lhs << '\n' << op << '\n' << rhs;
    }